

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void __thiscall
flatbuffers::php::PhpGenerator::GenStructAccessor
          (PhpGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  char *prefix;
  undefined1 local_48 [8];
  Type vectortype;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PhpGenerator *this_local;
  
  vectortype._24_8_ = code_ptr;
  prefix = (char *)std::__cxx11::string::c_str();
  GenComment(&(field->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,prefix);
  bVar1 = IsScalar((field->value).type.base_type);
  if (bVar1) {
    if ((struct_def->fixed & 1U) == 0) {
      GetScalarFieldOfTable(this,field,(string *)vectortype._24_8_);
    }
    else {
      GetScalarFieldOfStruct(field,(string *)vectortype._24_8_);
    }
  }
  else {
    switch((field->value).type.base_type) {
    case BASE_TYPE_STRING:
      GetStringField(this,field,(string *)vectortype._24_8_);
      break;
    case BASE_TYPE_VECTOR:
      Type::VectorType((Type *)local_48,&(field->value).type);
      if (local_48._0_4_ == BASE_TYPE_UNION) {
        GetMemberOfVectorOfUnion(this,field,(string *)vectortype._24_8_);
      }
      else if (local_48._0_4_ == BASE_TYPE_STRUCT) {
        GetMemberOfVectorOfStruct(this,struct_def,field,(string *)vectortype._24_8_);
      }
      else {
        GetMemberOfVectorOfNonStruct(this,field,(string *)vectortype._24_8_);
      }
      break;
    case BASE_TYPE_STRUCT:
      if ((struct_def->fixed & 1U) == 0) {
        GetStructFieldOfTable(this,field,(string *)vectortype._24_8_);
      }
      else {
        GetStructFieldOfStruct(this,field,(string *)vectortype._24_8_);
      }
      break;
    case BASE_TYPE_UNION:
      GetUnionField(this,field,(string *)vectortype._24_8_);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_php.cpp"
                    ,0x2c9,
                    "void flatbuffers::php::PhpGenerator::GenStructAccessor(const StructDef &, const FieldDef &, std::string *)"
                   );
    }
  }
  bVar1 = IsVector(&(field->value).type);
  if ((bVar1) &&
     (GetVectorLen(field,(string *)vectortype._24_8_),
     (field->value).type.element == BASE_TYPE_UCHAR)) {
    GetUByte(field,(string *)vectortype._24_8_);
  }
  return;
}

Assistant:

void GenStructAccessor(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr) {
    GenComment(field.doc_comment, code_ptr, nullptr, Indent.c_str());

    if (IsScalar(field.value.type.base_type)) {
      if (struct_def.fixed) {
        GetScalarFieldOfStruct(field, code_ptr);
      } else {
        GetScalarFieldOfTable(field, code_ptr);
      }
    } else {
      switch (field.value.type.base_type) {
        case BASE_TYPE_STRUCT:
          if (struct_def.fixed) {
            GetStructFieldOfStruct(field, code_ptr);
          } else {
            GetStructFieldOfTable(field, code_ptr);
          }
          break;
        case BASE_TYPE_STRING: GetStringField(field, code_ptr); break;
        case BASE_TYPE_VECTOR: {
          auto vectortype = field.value.type.VectorType();
          if (vectortype.base_type == BASE_TYPE_UNION) {
            GetMemberOfVectorOfUnion(field, code_ptr);
          } else if (vectortype.base_type == BASE_TYPE_STRUCT) {
            GetMemberOfVectorOfStruct(struct_def, field, code_ptr);
          } else {
            GetMemberOfVectorOfNonStruct(field, code_ptr);
          }
          break;
        }
        case BASE_TYPE_UNION: GetUnionField(field, code_ptr); break;
        default: FLATBUFFERS_ASSERT(0);
      }
    }
    if (IsVector(field.value.type)) {
      GetVectorLen(field, code_ptr);
      if (field.value.type.element == BASE_TYPE_UCHAR) {
        GetUByte(field, code_ptr);
      }
    }
  }